

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

int32 ps_lattice_posterior(ps_lattice_t *dag,ngram_model_t *lmset,float32 ascale)

{
  s3wid_t sVar1;
  logmath_t *lmath;
  ps_latnode_t *ppVar2;
  latlink_list_t *plVar3;
  ps_search_t *ppVar4;
  int iVar5;
  int32 iVar6;
  ps_latlink_t *ppVar7;
  uint uVar8;
  latlink_list_t **pplVar9;
  ngram_model_t *pnVar10;
  ps_latlink_s *ppVar11;
  ps_latnode_t **pppVar12;
  ngram_model_t *pnVar13;
  bool bVar14;
  bool bVar15;
  int32 from_wid;
  float32 local_54;
  ngram_model_t *local_50;
  int local_44;
  s3wid_t local_40;
  int32 n_used;
  ngram_model_t *local_38;
  
  lmath = dag->lmath;
  pppVar12 = &dag->nodes;
  local_54 = ascale;
  local_38 = lmset;
  while (ppVar2 = *pppVar12, ppVar2 != (ps_latnode_t *)0x0) {
    pplVar9 = &ppVar2->exits;
    while (plVar3 = *pplVar9, plVar3 != (latlink_list_t *)0x0) {
      iVar5 = logmath_get_zero(lmath);
      plVar3->link->beta = iVar5;
      pplVar9 = &plVar3->next;
    }
    pppVar12 = &ppVar2->next;
  }
  pnVar13 = (ngram_model_t *)0x0;
  ppVar7 = ps_lattice_reverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  local_44 = -0x80000000;
  while (ppVar7 != (ps_latlink_t *)0x0) {
    from_wid = ppVar7->from->basewid;
    sVar1 = ppVar7->to->basewid;
    iVar5 = dict_filler_word(dag->dict,from_wid);
    if (iVar5 == 0) {
      bVar14 = false;
    }
    else {
      bVar14 = ppVar7->from != dag->start;
    }
    local_50 = pnVar13;
    iVar5 = dict_filler_word(dag->dict,sVar1);
    if (iVar5 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = ppVar7->to != dag->end;
    }
    local_40 = sVar1;
    if ((!bVar15) && (ppVar11 = ppVar7, bVar14)) {
      do {
        ppVar11 = ppVar11->best_prev;
        if (ppVar11 == (ps_latlink_s *)0x0) {
          bVar14 = true;
          goto LAB_0010ff1e;
        }
        from_wid = ppVar11->from->basewid;
        iVar5 = dict_filler_word(dag->dict,from_wid);
      } while ((iVar5 != 0) && (ppVar11->from != dag->start));
      bVar14 = false;
    }
LAB_0010ff1e:
    iVar6 = 0;
    if ((local_38 != (ngram_model_t *)0x0) && (!bVar14 && !bVar15)) {
      iVar6 = ngram_ng_prob(local_38,local_40,&from_wid,1,&n_used);
    }
    if (ppVar7->to == dag->end) {
      pnVar13 = local_50;
      if (local_44 < ppVar7->path_scr) {
        local_44 = ppVar7->path_scr;
        pnVar13 = (ngram_model_t *)ppVar7;
      }
      ppVar7->beta = iVar6 + (int)((float)(dag->final_node_ascr << 10) * (float)local_54);
    }
    else {
      pplVar9 = &ppVar7->to->exits;
      while (plVar3 = *pplVar9, pnVar13 = local_50, plVar3 != (latlink_list_t *)0x0) {
        iVar5 = logmath_add(lmath,ppVar7->beta,
                            (int)((float)(plVar3->link->ascr << 10) * (float)local_54) +
                            plVar3->link->beta + iVar6);
        ppVar7->beta = iVar5;
        pplVar9 = &plVar3->next;
      }
    }
    ppVar7 = ps_lattice_reverse_next(dag,(ps_latnode_t *)0x0);
  }
  ppVar4 = dag->search;
  if ((ppVar4 == (ps_search_t *)0x0) || (iVar5 = strcmp(ppVar4->type,"ngram"), iVar5 != 0)) {
    pnVar10 = (ngram_model_t *)0x0;
  }
  else {
    pnVar10 = (ngram_model_t *)ppVar4[1].vt;
  }
  uVar8 = (uint)((float)(dag->final_node_ascr << 10) * (float)local_54);
  local_50 = pnVar10;
  do {
    if (pnVar13 == (ngram_model_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x5a3,"Joint P(O,S) = %d P(S|O) = %d\n",(ulong)uVar8,(ulong)(uVar8 - dag->norm));
      return uVar8 - dag->norm;
    }
    if (pnVar10 != (ngram_model_t *)0x0) {
      from_wid = ((ps_latlink_t *)pnVar13)->from->basewid;
      sVar1 = ((ps_latlink_t *)pnVar13)->to->basewid;
      iVar5 = dict_filler_word(dag->dict,from_wid);
      if (iVar5 == 0) {
        bVar14 = false;
      }
      else {
        bVar14 = ((ps_latlink_t *)pnVar13)->from != dag->start;
      }
      iVar5 = dict_filler_word(dag->dict,sVar1);
      if (iVar5 == 0) {
        bVar15 = false;
      }
      else {
        bVar15 = ((ps_latlink_t *)pnVar13)->to != dag->end;
      }
      if ((!bVar15) && (ppVar11 = (ps_latlink_s *)pnVar13, bVar14)) {
        do {
          ppVar11 = ppVar11->best_prev;
          if (ppVar11 == (ps_latlink_s *)0x0) {
            bVar14 = true;
            goto LAB_001100e6;
          }
          from_wid = ppVar11->from->basewid;
          iVar5 = dict_filler_word(dag->dict,from_wid);
        } while ((iVar5 != 0) && (ppVar11->from != dag->start));
        bVar14 = false;
      }
LAB_001100e6:
      pnVar10 = local_50;
      if (!bVar14 && !bVar15) {
        iVar6 = ngram_ng_prob(local_50,sVar1,&from_wid,1,&n_used);
        uVar8 = uVar8 + iVar6;
      }
    }
    uVar8 = uVar8 + (int)((float)(((ps_latlink_t *)pnVar13)->ascr << 10) * (float)local_54);
    pnVar13 = (ngram_model_t *)((ps_latlink_t *)pnVar13)->best_prev;
  } while( true );
}

Assistant:

int32
ps_lattice_posterior(ps_lattice_t *dag, ngram_model_t *lmset,
                     float32 ascale)
{
    logmath_t *lmath;
    ps_latnode_t *node;
    ps_latlink_t *link;
    latlink_list_t *x;
    ps_latlink_t *bestend;
    int32 bestescr;

    lmath = dag->lmath;

    /* Reset all betas to zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->beta = logmath_get_zero(lmath);
        }
    }

    bestend = NULL;
    bestescr = MAX_NEG_INT32;
    /* Accumulate backward probabilities for all links. */
    for (link = ps_lattice_reverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_reverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 from_wid, to_wid;
        int16 from_is_fil, to_is_fil;

        from_wid = link->from->basewid;
        to_wid = link->to->basewid;
        from_is_fil = dict_filler_word(dag->dict, from_wid) && link->from != dag->start;
        to_is_fil = dict_filler_word(dag->dict, to_wid) && link->to != dag->end;

        /* Find word predecessor if from-word is filler */
        if (!to_is_fil && from_is_fil) {
            ps_latlink_t *prev_link = link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(dag->dict, from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate LM probability. */
        if (lmset && !from_is_fil && !to_is_fil)
            bprob = ngram_ng_prob(lmset, to_wid, &from_wid, 1, &n_used);
        else
            bprob = 0;

        if (link->to == dag->end) {
            /* Track the best path - we will backtrace in order to
               calculate the unscaled joint probability for sentence
               posterior. */
            if (link->path_scr BETTER_THAN bestescr) {
                bestescr = link->path_scr;
                bestend = link;
            }
            /* Imaginary exit link from final node has beta = 1.0 */
            link->beta = bprob + (int32)((dag->final_node_ascr << SENSCR_SHIFT) * ascale);
        }
        else {
            /* Update beta from all outgoing betas. */
            for (x = link->to->exits; x; x = x->next) {
                link->beta = logmath_add(lmath, link->beta,
                                         x->link->beta + bprob
                                         + (int)((x->link->ascr << SENSCR_SHIFT) * ascale));
            }
        }
    }

    /* Return P(S|O) = P(O,S)/P(O) */
    return ps_lattice_joint(dag, bestend, ascale) - dag->norm;
}